

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_gencall(ASMState *as,CCallInfo *ci,IRRef *args)

{
  IRIns *ir;
  uint uVar1;
  uint ref;
  MCode *pMVar2;
  byte bVar3;
  MCode MVar4;
  uint uVar5;
  Reg RVar6;
  MCode *pMVar7;
  uint uVar8;
  uint dst;
  uint uVar9;
  ulong uVar10;
  int32_t ofs;
  uint local_40;
  
  uVar1 = ci->flags;
  uVar5 = uVar1;
  if (ci->func != (ASMFunction)0x0) {
    emit_call_(as,(MCode *)ci->func);
    uVar5 = ci->flags;
  }
  if ((uVar5 >> 0xb & 1) == 0) {
    pMVar7 = (MCode *)0x0;
  }
  else {
    pMVar2 = as->mcp;
    pMVar7 = pMVar2 + -1;
    as->mcp = pMVar2 + -2;
    pMVar2[-2] = 0xb0;
  }
  MVar4 = '\0';
  local_40 = uVar1 & 0xff;
  if (local_40 != 0) {
    ofs = 0;
    uVar8 = 0x128088c7;
    uVar5 = 0x10;
    uVar10 = 0;
    do {
      ref = args[uVar10];
      ir = as->ir + ref;
      if ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2) {
        if (uVar5 < 0x18) {
          if (uVar5 != 0) {
            uVar9 = uVar8;
            dst = uVar5;
            uVar5 = uVar5 + 1;
            goto LAB_0013ff15;
          }
          uVar5 = 1;
        }
        RVar6 = (Reg)(char)(ir->field_1).r;
        if ((char)(ir->field_1).r < '\0') {
          RVar6 = ra_allocref(as,ref,0xffff0000);
        }
        bVar3 = (byte)RVar6 & 0x1f;
        as->weakset = as->weakset & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        emit_rmro(as,(uint)(((ir->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_MOVSDto,RVar6,4,ofs);
        ofs = ofs + 8;
      }
      else {
        uVar9 = uVar8 >> 5;
        dst = uVar8 & 0x1f;
        if (dst == 0) {
          RVar6 = (Reg)(char)(ir->field_1).r;
          if ((char)(ir->field_1).r < '\0') {
            RVar6 = ra_allocref(as,ref,0xbfef);
          }
          bVar3 = (byte)RVar6 & 0x1f;
          as->weakset = as->weakset & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
          emit_rmro(as,XO_MOVto,RVar6 | 0x80200,4,ofs);
          ofs = ofs + 8;
          uVar8 = uVar9;
        }
        else {
LAB_0013ff15:
          uVar8 = uVar9;
          if ((ref < 0x7ffd) && (dst < 0x10)) {
            if (((ir->field_1).o == '\x17') || ((ir->field_1).o == '\x1b')) {
              emit_loadi(as,dst,ir->i);
            }
            else {
              emit_loadu64(as,dst,(uint64_t)ir[1]);
            }
          }
          else if ((char)(ir->field_1).r < '\0') {
            ra_allocref(as,ref,1 << ((byte)dst & 0x1f));
          }
          else {
            bVar3 = (ir->field_1).r & 0x1f;
            as->weakset = as->weakset & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
            emit_movrr(as,ir,dst,(uint)(ir->field_1).r);
          }
        }
      }
      if (as->mcp < as->mclim) {
        asm_mclimit(as);
      }
      uVar10 = uVar10 + 1;
    } while ((byte)uVar1 != uVar10);
    MVar4 = (char)uVar5 + 0xf0;
  }
  if (pMVar7 != (MCode *)0x0) {
    *pMVar7 = MVar4;
  }
  return;
}

Assistant:

static void asm_gencall(ASMState *as, const CCallInfo *ci, IRRef *args)
{
  uint32_t n, nargs = CCI_XNARGS(ci);
  int32_t ofs = STACKARG_OFS;
#if LJ_64
  uint32_t gprs = REGARG_GPRS;
  Reg fpr = REGARG_FIRSTFPR;
#if !LJ_ABI_WIN
  MCode *patchnfpr = NULL;
#endif
#else
  uint32_t gprs = 0;
  if ((ci->flags & CCI_CC_MASK) != CCI_CC_CDECL) {
    if ((ci->flags & CCI_CC_MASK) == CCI_CC_THISCALL)
      gprs = (REGARG_GPRS & 31);
    else if ((ci->flags & CCI_CC_MASK) == CCI_CC_FASTCALL)
      gprs = REGARG_GPRS;
  }
#endif
  if ((void *)ci->func)
    emit_call(as, ci->func);
#if LJ_64
  if ((ci->flags & CCI_VARARG)) {  /* Special handling for vararg calls. */
#if LJ_ABI_WIN
    for (n = 0; n < 4 && n < nargs; n++) {
      IRIns *ir = IR(args[n]);
      if (irt_isfp(ir->t))  /* Duplicate FPRs in GPRs. */
	emit_rr(as, XO_MOVDto, (irt_isnum(ir->t) ? REX_64 : 0) | (fpr+n),
		((gprs >> (n*5)) & 31));  /* Either MOVD or MOVQ. */
    }
#else
    patchnfpr = --as->mcp;  /* Indicate number of used FPRs in register al. */
    *--as->mcp = XI_MOVrib | RID_EAX;
#endif
  }
#endif
  for (n = 0; n < nargs; n++) {  /* Setup args. */
    IRRef ref = args[n];
    IRIns *ir = IR(ref);
    Reg r;
#if LJ_64 && LJ_ABI_WIN
    /* Windows/x64 argument registers are strictly positional. */
    r = irt_isfp(ir->t) ? (fpr <= REGARG_LASTFPR ? fpr : 0) : (gprs & 31);
    fpr++; gprs >>= 5;
#elif LJ_64
    /* POSIX/x64 argument registers are used in order of appearance. */
    if (irt_isfp(ir->t)) {
      r = fpr <= REGARG_LASTFPR ? fpr++ : 0;
    } else {
      r = gprs & 31; gprs >>= 5;
    }
#else
    if (ref && irt_isfp(ir->t)) {
      r = 0;
    } else {
      r = gprs & 31; gprs >>= 5;
      if (!ref) continue;
    }
#endif
    if (r) {  /* Argument is in a register. */
      if (r < RID_MAX_GPR && ref < ASMREF_TMP1) {
#if LJ_64
	if (LJ_GC64 ? !(ir->o == IR_KINT || ir->o == IR_KNULL) : ir->o == IR_KINT64)
	  emit_loadu64(as, r, ir_k64(ir)->u64);
	else
#endif
	  emit_loadi(as, r, ir->i);
      } else {
	/* Must have been evicted. */
	lj_assertA(rset_test(as->freeset, r), "reg %d not free", r);
	if (ra_hasreg(ir->r)) {
	  ra_noweak(as, ir->r);
	  emit_movrr(as, ir, r, ir->r);
	} else {
	  ra_allocref(as, ref, RID2RSET(r));
	}
      }
    } else if (irt_isfp(ir->t)) {  /* FP argument is on stack. */
      lj_assertA(!(irt_isfloat(ir->t) && irref_isk(ref)),
		 "unexpected float constant");
      if (LJ_32 && (ofs & 4) && irref_isk(ref)) {
	/* Split stores for unaligned FP consts. */
	emit_movmroi(as, RID_ESP, ofs, (int32_t)ir_knum(ir)->u32.lo);
	emit_movmroi(as, RID_ESP, ofs+4, (int32_t)ir_knum(ir)->u32.hi);
      } else {
	r = ra_alloc1(as, ref, RSET_FPR);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSDto : XO_MOVSSto,
		  r, RID_ESP, ofs);
      }
      ofs += (LJ_32 && irt_isfloat(ir->t)) ? 4 : 8;
    } else {  /* Non-FP argument is on stack. */
      if (LJ_32 && ref < ASMREF_TMP1) {
	emit_movmroi(as, RID_ESP, ofs, ir->i);
      } else {
	r = ra_alloc1(as, ref, RSET_GPR);
	emit_movtomro(as, REX_64 + r, RID_ESP, ofs);
      }
      ofs += sizeof(intptr_t);
    }
    checkmclim(as);
  }
#if LJ_64 && !LJ_ABI_WIN
  if (patchnfpr) *patchnfpr = fpr - REGARG_FIRSTFPR;
#endif
}